

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O2

void __thiscall cmCTestBZR::LogParser::StartElement(LogParser *this,string *name,char **param_2)

{
  pointer pcVar1;
  bool bVar2;
  undefined1 local_128 [8];
  _Alloc_hider local_120;
  undefined1 local_118 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  pcVar1 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish != pcVar1) {
    (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar1;
  }
  bVar2 = std::operator==(name,"log");
  if (bVar2) {
    memset(local_118,0,0xf0);
    local_120._M_p = (pointer)0x0;
    local_118._16_8_ = &local_f8;
    local_f8._M_local_buf[0] = '\0';
    local_e8._M_p = (pointer)&local_d8;
    local_d8._M_local_buf[0] = '\0';
    local_c8._M_p = (pointer)&local_b8;
    local_b8._M_local_buf[0] = '\0';
    local_a8._M_p = (pointer)&local_98;
    local_98._M_local_buf[0] = '\0';
    local_88._M_p = (pointer)&local_78;
    local_78._M_local_buf[0] = '\0';
    local_68._M_p = (pointer)&local_58;
    local_58._M_local_buf[0] = '\0';
    local_48._M_p = (pointer)&local_38;
    local_38._M_local_buf[0] = '\0';
    local_128 = (undefined1  [8])local_118;
    cmCTestVC::Revision::operator=(&this->Rev,(Revision *)local_128);
    cmCTestVC::Revision::~Revision((Revision *)local_128);
    std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::clear
              (&this->Changes);
  }
  else {
    bVar2 = std::operator==(name,"modified");
    if (((bVar2) || (bVar2 = std::operator==(name,"renamed"), bVar2)) ||
       (bVar2 = std::operator==(name,"kind-changed"), bVar2)) {
      local_128[0] = 0x3f;
      local_120._M_p = local_118 + 8;
      local_118._0_8_ = 0;
      local_118[8] = '\0';
      cmCTestGlobalVC::Change::operator=(&this->CurChange,(Change *)local_128);
      std::__cxx11::string::~string((string *)&local_120);
      (this->CurChange).Action = 'M';
    }
    else {
      bVar2 = std::operator==(name,"added");
      if (bVar2) {
        local_128[0] = '?';
        local_120._M_p = local_118 + 8;
        local_118._0_8_ = 0;
        local_118[8] = '\0';
        cmCTestGlobalVC::Change::operator=(&this->CurChange,(Change *)local_128);
        std::__cxx11::string::~string((string *)&local_120);
        local_128[0] = 0x41;
      }
      else {
        bVar2 = std::operator==(name,"removed");
        if (bVar2) {
          local_128[0] = '?';
          local_120._M_p = local_118 + 8;
          local_118._0_8_ = 0;
          local_118[8] = '\0';
          cmCTestGlobalVC::Change::operator=(&this->CurChange,(Change *)local_128);
          std::__cxx11::string::~string((string *)&local_120);
          local_128[0] = 0x44;
        }
        else {
          bVar2 = std::operator==(name,"unknown");
          if ((!bVar2) && (bVar2 = std::operator==(name,"conflicts"), !bVar2)) {
            return;
          }
          local_128[0] = 0x3f;
        }
      }
      local_120._M_p = local_118 + 8;
      local_118[8] = '\0';
      local_118._0_8_ = 0;
      cmCTestGlobalVC::Change::operator=(&this->CurChange,(Change *)local_128);
      std::__cxx11::string::~string((string *)&local_120);
    }
  }
  return;
}

Assistant:

void StartElement(const std::string& name, const char** /*atts*/) override
  {
    this->CData.clear();
    if (name == "log") {
      this->Rev = Revision();
      this->Changes.clear();
    }
    // affected-files can contain blocks of
    // modified, unknown, renamed, kind-changed, removed, conflicts, added
    else if (name == "modified" || name == "renamed" ||
             name == "kind-changed") {
      this->CurChange = Change();
      this->CurChange.Action = 'M';
    } else if (name == "added") {
      this->CurChange = Change();
      this->CurChange = 'A';
    } else if (name == "removed") {
      this->CurChange = Change();
      this->CurChange = 'D';
    } else if (name == "unknown" || name == "conflicts") {
      // Should not happen here
      this->CurChange = Change();
    }
  }